

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appInit.cxx
# Opt level: O1

int __thiscall app::App::init(App *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  SDL_Window *pSVar2;
  SDL_Renderer *pSVar3;
  SDL_Texture *pSVar4;
  Uint32 *__s;
  ostream *poVar5;
  char *pcVar6;
  InitError *pIVar7;
  long lVar8;
  ulong uVar9;
  size_t __n;
  stringstream ss;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  iVar1 = SDL_Init(0x30);
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"SDL_Init failed with code ",0x1a);
    poVar5 = (ostream *)std::ostream::operator<<(local_198,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    pcVar6 = (char *)SDL_GetError();
    std::operator<<(poVar5,pcVar6);
    pIVar7 = (InitError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    error::InitError::InitError(pIVar7,&sStack_1c8);
    __cxa_throw(pIVar7,&error::InitError::typeinfo,error::InitError::~InitError);
  }
  iVar1 = SDL_GetNumVideoDrivers();
  if (iVar1 < 1) {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"0 drivers found",0xf);
    pIVar7 = (InitError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    error::InitError::InitError(pIVar7,&sStack_1c8);
    __cxa_throw(pIVar7,&error::InitError::typeinfo,error::InitError::~InitError);
  }
  iVar1 = SDL_VideoInit(0);
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"SDL_VideoInit failed with code ",0x1f);
    poVar5 = (ostream *)std::ostream::operator<<(local_198,(uint)(iVar1 != 0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    pcVar6 = (char *)SDL_GetError();
    std::operator<<(poVar5,pcVar6);
    pIVar7 = (InitError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    error::InitError::InitError(pIVar7,&sStack_1c8);
    __cxa_throw(pIVar7,&error::InitError::typeinfo,error::InitError::~InitError);
  }
  iVar1 = SDL_GetNumVideoDisplays();
  if (iVar1 < 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"SDL_GetNumVideoDisplays returned ",0x21);
    std::ostream::operator<<(local_198,(uint)(iVar1 < 1));
    pIVar7 = (InitError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    error::InitError::InitError(pIVar7,&sStack_1c8);
    __cxa_throw(pIVar7,&error::InitError::typeinfo,error::InitError::~InitError);
  }
  iVar1 = SDL_GetCurrentDisplayMode(0,&this->display);
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"SDL_GetCurrentDisplayMode failed with code ",0x2b);
    poVar5 = (ostream *)std::ostream::operator<<(local_198,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    pcVar6 = (char *)SDL_GetError();
    std::operator<<(poVar5,pcVar6);
    pIVar7 = (InitError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    error::InitError::InitError(pIVar7,&sStack_1c8);
    __cxa_throw(pIVar7,&error::InitError::typeinfo,error::InitError::~InitError);
  }
  pSVar2 = (SDL_Window *)
           SDL_CreateWindow((this->title)._M_dataplus._M_p,0x2fff0000,0x2fff0000,(this->display).w,
                            (this->display).h,0x2103);
  this->window = pSVar2;
  if (pSVar2 == (SDL_Window *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"SDL_CreateWindow failed: ",0x19);
    pcVar6 = (char *)SDL_GetError();
    std::operator<<(local_198,pcVar6);
    pIVar7 = (InitError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    error::InitError::InitError(pIVar7,&sStack_1c8);
    __cxa_throw(pIVar7,&error::InitError::typeinfo,error::InitError::~InitError);
  }
  pSVar3 = (SDL_Renderer *)SDL_CreateRenderer(pSVar2,0xffffffff,6);
  this->renderer = pSVar3;
  if (pSVar3 == (SDL_Renderer *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"SDL_CreateRenderer failed: ",0x1b)
    ;
    pcVar6 = (char *)SDL_GetError();
    std::operator<<(local_198,pcVar6);
    pIVar7 = (InitError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    error::InitError::InitError(pIVar7,&sStack_1c8);
    __cxa_throw(pIVar7,&error::InitError::typeinfo,error::InitError::~InitError);
  }
  pSVar4 = (SDL_Texture *)SDL_CreateTexture(pSVar3,0x16362004,0,(this->display).w,(this->display).h)
  ;
  this->texture = pSVar4;
  if (pSVar4 != (SDL_Texture *)0x0) {
    lVar8 = (long)(this->display).h * (long)(this->display).w;
    __n = lVar8 * 4;
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)lVar8) {
      uVar9 = __n;
    }
    __s = (Uint32 *)operator_new__(uVar9);
    this->pixels = __s;
    memset(__s,0xff,__n);
    SDL_ShowWindow(this->window);
    std::__cxx11::stringstream::~stringstream(local_1a8);
    iVar1 = std::ios_base::~ios_base(local_128);
    return iVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"SDL_CreateTexture failed: ",0x1a);
  pcVar6 = (char *)SDL_GetError();
  std::operator<<(local_198,pcVar6);
  pIVar7 = (InitError *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  error::InitError::InitError(pIVar7,&sStack_1c8);
  __cxa_throw(pIVar7,&error::InitError::typeinfo,error::InitError::~InitError);
}

Assistant:

void App::init() throw (error::InitError)
{
     std::stringstream ss;

     int initOk = SDL_Init(SDL_INIT_VIDEO|SDL_INIT_AUDIO);

     if (initOk != 0) {
          ss << "SDL_Init failed with code " << initOk
             << ": " << SDL_GetError();

          throw error::InitError(ss.str());
     }

     if (SDL_GetNumVideoDrivers() > 0) {
          if (int v = SDL_VideoInit(NULL) != 0) {
               ss << "SDL_VideoInit failed with code " << v
                  << ": " << SDL_GetError();

               throw error::InitError(ss.str());
          }
     } else {
          ss << "0 drivers found";

          throw error::InitError(ss.str());
     }

     if(int numDisp = SDL_GetNumVideoDisplays() < 1) {
          ss << "SDL_GetNumVideoDisplays returned " << numDisp;

          throw error::InitError(ss.str());
     }

     initOk = SDL_GetCurrentDisplayMode(0, &display);
     if (initOk != 0) {
          ss << "SDL_GetCurrentDisplayMode failed with code " << initOk
             << ": " << SDL_GetError();

          throw error::InitError(ss.str());
     }

     window = SDL_CreateWindow(title.c_str(),
                               SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED,
                               display.w, display.h,
                               SDL_WINDOW_FULLSCREEN |
                               SDL_WINDOW_ALLOW_HIGHDPI |
                               SDL_WINDOW_OPENGL |
                               SDL_WINDOW_INPUT_GRABBED);
     if (window == NULL) {
          ss << "SDL_CreateWindow failed: " << SDL_GetError();

          throw error::InitError(ss.str());
     }

     renderer = SDL_CreateRenderer(window, -1,
                                   SDL_RENDERER_ACCELERATED |
                                   SDL_RENDERER_PRESENTVSYNC);
     if (renderer == NULL) {
          ss << "SDL_CreateRenderer failed: " << SDL_GetError();

          throw error::InitError(ss.str());
     }

     texture = SDL_CreateTexture(
          renderer,
          SDL_PIXELFORMAT_ARGB8888, SDL_TEXTUREACCESS_STATIC,
          display.w, display.h);
     if (texture == NULL) {
          ss << "SDL_CreateTexture failed: " << SDL_GetError();

          throw error::InitError(ss.str());
     }

     pixels = new Uint32[display.w * display.h];
     memset(pixels, 255, display.w * display.h * sizeof(Uint32));

     SDL_ShowWindow(window);
}